

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O3

void __thiscall
gl4cts::CopyImage::InvalidTargetTest::InvalidTargetTest(InvalidTargetTest *this,Context *context)

{
  pointer *pptVar1;
  GLenum GVar2;
  iterator iVar3;
  long lVar4;
  GLuint src;
  uint uVar5;
  GLenum src_target_1;
  long lVar6;
  GLenum src_target;
  testCase test_case;
  testCase local_4c;
  vector<gl4cts::CopyImage::InvalidTargetTest::testCase,std::allocator<gl4cts::CopyImage::InvalidTargetTest::testCase>>
  *local_40;
  long local_38;
  
  tcu::TestCase::TestCase
            ((TestCase *)this,context->m_testCtx,"invalid_target",
             "Test verifies if INVALID_ENUM is generated when invalid target is provided to CopySubImageData"
            );
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__InvalidTargetTest_020c3858;
  local_40 = (vector<gl4cts::CopyImage::InvalidTargetTest::testCase,std::allocator<gl4cts::CopyImage::InvalidTargetTest::testCase>>
              *)&this->m_test_cases;
  (this->m_test_cases).
  super__Vector_base<gl4cts::CopyImage::InvalidTargetTest::testCase,_std::allocator<gl4cts::CopyImage::InvalidTargetTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_test_cases).
  super__Vector_base<gl4cts::CopyImage::InvalidTargetTest::testCase,_std::allocator<gl4cts::CopyImage::InvalidTargetTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_test_cases).
  super__Vector_base<gl4cts::CopyImage::InvalidTargetTest::testCase,_std::allocator<gl4cts::CopyImage::InvalidTargetTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_dst_buf_name = 0;
  this->m_dst_tex_name = 0;
  this->m_src_buf_name = 0;
  this->m_src_tex_name = 0;
  this->m_test_case_index = 0;
  lVar4 = 0;
  do {
    GVar2 = (&s_valid_targets)[lVar4];
    uVar5 = 0xfffffffb;
    lVar6 = 0;
    local_38 = lVar4;
    do {
      local_4c.m_dst_target = *(GLenum *)((long)&s_valid_targets + lVar6);
      local_4c.m_expected_result = 0;
      if (uVar5 < 2 != (int)lVar4 - 5U < 2) {
        local_4c.m_expected_result = 0x502;
      }
      iVar3._M_current =
           (this->m_test_cases).
           super__Vector_base<gl4cts::CopyImage::InvalidTargetTest::testCase,_std::allocator<gl4cts::CopyImage::InvalidTargetTest::testCase>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (this->m_test_cases).
          super__Vector_base<gl4cts::CopyImage::InvalidTargetTest::testCase,_std::allocator<gl4cts::CopyImage::InvalidTargetTest::testCase>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_4c.m_src_target = GVar2;
        std::
        vector<gl4cts::CopyImage::InvalidTargetTest::testCase,std::allocator<gl4cts::CopyImage::InvalidTargetTest::testCase>>
        ::_M_realloc_insert<gl4cts::CopyImage::InvalidTargetTest::testCase_const&>
                  (local_40,iVar3,&local_4c);
      }
      else {
        (iVar3._M_current)->m_expected_result = local_4c.m_expected_result;
        (iVar3._M_current)->m_src_target = GVar2;
        (iVar3._M_current)->m_dst_target = local_4c.m_dst_target;
        pptVar1 = &(this->m_test_cases).
                   super__Vector_base<gl4cts::CopyImage::InvalidTargetTest::testCase,_std::allocator<gl4cts::CopyImage::InvalidTargetTest::testCase>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pptVar1 = *pptVar1 + 1;
      }
      uVar5 = uVar5 + 1;
      lVar6 = lVar6 + 4;
    } while (lVar6 != 0x2c);
    lVar4 = local_38 + 1;
  } while (lVar4 != 0xb);
  lVar4 = 0;
  do {
    GVar2 = (&s_invalid_targets)[lVar4];
    lVar6 = 0;
    do {
      local_4c.m_dst_target = *(GLenum *)((long)&s_invalid_targets + lVar6);
      local_4c.m_expected_result = 0x500;
      iVar3._M_current =
           (this->m_test_cases).
           super__Vector_base<gl4cts::CopyImage::InvalidTargetTest::testCase,_std::allocator<gl4cts::CopyImage::InvalidTargetTest::testCase>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (this->m_test_cases).
          super__Vector_base<gl4cts::CopyImage::InvalidTargetTest::testCase,_std::allocator<gl4cts::CopyImage::InvalidTargetTest::testCase>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_4c.m_src_target = GVar2;
        std::
        vector<gl4cts::CopyImage::InvalidTargetTest::testCase,std::allocator<gl4cts::CopyImage::InvalidTargetTest::testCase>>
        ::_M_realloc_insert<gl4cts::CopyImage::InvalidTargetTest::testCase_const&>
                  (local_40,iVar3,&local_4c);
      }
      else {
        (iVar3._M_current)->m_expected_result = 0x500;
        (iVar3._M_current)->m_src_target = GVar2;
        (iVar3._M_current)->m_dst_target = local_4c.m_dst_target;
        pptVar1 = &(this->m_test_cases).
                   super__Vector_base<gl4cts::CopyImage::InvalidTargetTest::testCase,_std::allocator<gl4cts::CopyImage::InvalidTargetTest::testCase>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pptVar1 = *pptVar1 + 1;
      }
      lVar6 = lVar6 + 4;
    } while (lVar6 != 0x44);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x11);
  lVar4 = 0;
  do {
    GVar2 = (&s_invalid_targets)[lVar4];
    lVar6 = 0;
    do {
      local_4c.m_dst_target = *(GLenum *)((long)&s_valid_targets + lVar6);
      local_4c.m_expected_result = 0x500;
      iVar3._M_current =
           (this->m_test_cases).
           super__Vector_base<gl4cts::CopyImage::InvalidTargetTest::testCase,_std::allocator<gl4cts::CopyImage::InvalidTargetTest::testCase>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (this->m_test_cases).
          super__Vector_base<gl4cts::CopyImage::InvalidTargetTest::testCase,_std::allocator<gl4cts::CopyImage::InvalidTargetTest::testCase>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_4c.m_src_target = GVar2;
        std::
        vector<gl4cts::CopyImage::InvalidTargetTest::testCase,std::allocator<gl4cts::CopyImage::InvalidTargetTest::testCase>>
        ::_M_realloc_insert<gl4cts::CopyImage::InvalidTargetTest::testCase_const&>
                  (local_40,iVar3,&local_4c);
      }
      else {
        (iVar3._M_current)->m_expected_result = 0x500;
        (iVar3._M_current)->m_src_target = GVar2;
        (iVar3._M_current)->m_dst_target = local_4c.m_dst_target;
        pptVar1 = &(this->m_test_cases).
                   super__Vector_base<gl4cts::CopyImage::InvalidTargetTest::testCase,_std::allocator<gl4cts::CopyImage::InvalidTargetTest::testCase>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pptVar1 = *pptVar1 + 1;
      }
      lVar6 = lVar6 + 4;
    } while (lVar6 != 0x2c);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x11);
  lVar4 = 0;
  do {
    GVar2 = (&s_valid_targets)[lVar4];
    lVar6 = 0;
    do {
      local_4c.m_dst_target = *(GLenum *)((long)&s_invalid_targets + lVar6);
      local_4c.m_expected_result = 0x500;
      iVar3._M_current =
           (this->m_test_cases).
           super__Vector_base<gl4cts::CopyImage::InvalidTargetTest::testCase,_std::allocator<gl4cts::CopyImage::InvalidTargetTest::testCase>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (this->m_test_cases).
          super__Vector_base<gl4cts::CopyImage::InvalidTargetTest::testCase,_std::allocator<gl4cts::CopyImage::InvalidTargetTest::testCase>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_4c.m_src_target = GVar2;
        std::
        vector<gl4cts::CopyImage::InvalidTargetTest::testCase,std::allocator<gl4cts::CopyImage::InvalidTargetTest::testCase>>
        ::_M_realloc_insert<gl4cts::CopyImage::InvalidTargetTest::testCase_const&>
                  (local_40,iVar3,&local_4c);
      }
      else {
        (iVar3._M_current)->m_expected_result = 0x500;
        (iVar3._M_current)->m_src_target = GVar2;
        (iVar3._M_current)->m_dst_target = local_4c.m_dst_target;
        pptVar1 = &(this->m_test_cases).
                   super__Vector_base<gl4cts::CopyImage::InvalidTargetTest::testCase,_std::allocator<gl4cts::CopyImage::InvalidTargetTest::testCase>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pptVar1 = *pptVar1 + 1;
      }
      lVar6 = lVar6 + 4;
    } while (lVar6 != 0x44);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0xb);
  return;
}

Assistant:

InvalidTargetTest::InvalidTargetTest(deqp::Context& context)
	: TestCase(context, "invalid_target",
			   "Test verifies if INVALID_ENUM is generated when invalid target is provided to CopySubImageData")
	, m_dst_buf_name(0)
	, m_dst_tex_name(0)
	, m_src_buf_name(0)
	, m_src_tex_name(0)
	, m_test_case_index(0)
{

	/* Valid source, valid dst */
	for (GLuint src = 0; src < s_n_valid_targets; ++src)
	{
		for (GLuint dst = 0; dst < s_n_valid_targets; ++dst)
		{
			const GLenum src_target = s_valid_targets[src];
			const GLenum dst_target = s_valid_targets[dst];
			testCase	 test_case  = { src_target, dst_target, GL_NO_ERROR };

			if (Utils::isTargetMultisampled(dst_target) != Utils::isTargetMultisampled(src_target))
			{
				test_case.m_expected_result = GL_INVALID_OPERATION;
			}

			m_test_cases.push_back(test_case);
		}
	}

	/* Invalid source, invalid dst */
	for (GLuint src = 0; src < s_n_invalid_targets; ++src)
	{
		for (GLuint dst = 0; dst < s_n_invalid_targets; ++dst)
		{
			const GLenum   src_target = s_invalid_targets[src];
			const GLenum   dst_target = s_invalid_targets[dst];
			const testCase test_case  = { src_target, dst_target, GL_INVALID_ENUM };

			m_test_cases.push_back(test_case);
		}
	}

	/* Invalid source, valid dst */
	for (GLuint src = 0; src < s_n_invalid_targets; ++src)
	{
		for (GLuint dst = 0; dst < s_n_valid_targets; ++dst)
		{
			const GLenum   src_target = s_invalid_targets[src];
			const GLenum   dst_target = s_valid_targets[dst];
			const testCase test_case  = { src_target, dst_target, GL_INVALID_ENUM };

			m_test_cases.push_back(test_case);
		}
	}

	/* Valid source, invalid dst */
	for (GLuint src = 0; src < s_n_valid_targets; ++src)
	{
		for (GLuint dst = 0; dst < s_n_invalid_targets; ++dst)
		{
			const GLenum   src_target = s_valid_targets[src];
			const GLenum   dst_target = s_invalid_targets[dst];
			const testCase test_case  = { src_target, dst_target, GL_INVALID_ENUM };

			m_test_cases.push_back(test_case);
		}
	}
}